

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int str_char(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  luaL_Buffer b;
  
  iVar1 = lua_gettop(L);
  luaL_buffinit(L,&b);
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  for (iVar1 = 1; iVar1 - iVar3 != 1; iVar1 = iVar1 + 1) {
    uVar2 = luaL_checkinteger(L,iVar1);
    if ((uVar2 & 0xffffff00) != 0) {
      luaL_argerror(L,iVar1,"invalid value");
    }
    if (&stack0xffffffffffffffd0 <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = (char)uVar2;
    b.p = b.p + 1;
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int str_char (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  for (i=1; i<=n; i++) {
    int c = luaL_checkint(L, i);
    luaL_argcheck(L, uchar(c) == c, i, "invalid value");
    luaL_addchar(&b, uchar(c));
  }
  luaL_pushresult(&b);
  return 1;
}